

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::skip_variable_marker(jpeg_decoder *this)

{
  uint uVar1;
  int num_bits;
  jpeg_decoder *in_RDI;
  uint num_left;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  jpeg_decoder *this_00;
  
  this_00 = in_RDI;
  uVar1 = get_bits(in_RDI,in_stack_fffffffffffffff4);
  if (uVar1 < 2) {
    stop_decoding((jpeg_decoder *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                  (jpgd_status)((ulong)in_RDI >> 0x20));
  }
  for (num_bits = uVar1 - 2; num_bits != 0; num_bits = num_bits + -1) {
    get_bits(this_00,num_bits);
  }
  return;
}

Assistant:

void jpeg_decoder::skip_variable_marker()
	{
		uint num_left;

		num_left = get_bits(16);

		if (num_left < 2)
			stop_decoding(JPGD_BAD_VARIABLE_MARKER);

		num_left -= 2;

		while (num_left)
		{
			get_bits(8);
			num_left--;
		}
	}